

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O2

int icctoclrspc(int iccclrspc,int refflag)

{
  int iVar1;
  
  if (refflag == 0) {
    if (iccclrspc == 0x47524159) {
      iVar1 = 0x300;
    }
    else {
      iVar1 = 0x500;
      if (iccclrspc != 0x59436272) {
        if (iccclrspc != 0x52474220) goto LAB_0010b5a4;
        iVar1 = 0x400;
      }
    }
  }
  else {
    iVar1 = 0x101;
    if (iccclrspc != 0x58595a20) {
      if (iccclrspc != 0x4c616220) {
LAB_0010b5a4:
        abort();
      }
      iVar1 = 0x201;
    }
  }
  return iVar1;
}

Assistant:

static int icctoclrspc(int iccclrspc, int refflag)
{
	if (refflag) {
		switch (iccclrspc) {
		case JAS_ICC_COLORSPC_XYZ:
			return JAS_CLRSPC_CIEXYZ;
		case JAS_ICC_COLORSPC_LAB:
			return JAS_CLRSPC_CIELAB;
		default:
			abort();
			break;
		}
	} else {
		switch (iccclrspc) {
		case JAS_ICC_COLORSPC_YCBCR:
			return JAS_CLRSPC_GENYCBCR;
		case JAS_ICC_COLORSPC_RGB:
			return JAS_CLRSPC_GENRGB;
		case JAS_ICC_COLORSPC_GRAY:
			return JAS_CLRSPC_GENGRAY;
		default:
			abort();
			break;
		}
	}
}